

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall
xray_re::cse_alife_object_physic::update_read(cse_alife_object_physic *this,xr_packet *packet)

{
  bool bVar1;
  uint uVar2;
  uint_fast16_t flags;
  xr_packet *packet_local;
  cse_alife_object_physic *this_local;
  
  cse_ph_skeleton::update_read(&this->super_cse_ph_skeleton,packet);
  bVar1 = xr_packet::r_eof(packet);
  if (!bVar1) {
    bVar1 = false;
    if (0x79 < (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
               super_cse_alife_object.super_cse_abstract.m_version) {
      bVar1 = (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
              super_cse_alife_object.super_cse_abstract.m_version < 0x81;
    }
    if (!bVar1) {
      __assert_fail("m_version >= CSE_VERSION_0x7a && m_version <= CSE_VERSION_COP",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                    ,0x264,"virtual void xray_re::cse_alife_object_physic::update_read(xr_packet &)"
                   );
    }
    xr_packet::r_u8(packet,&this->m_num_items);
    if (this->m_num_items != '\0') {
      xr_packet::r_vec3(packet,&(this->m_state).force);
      xr_packet::r_vec3(packet,&(this->m_state).torque);
      xr_packet::r_vec3(packet,&(this->m_state).position);
      xr_packet::r_float(packet,&(this->m_state).field_6.max_velocity);
      xr_packet::r_float(packet,(float *)((long)&(this->m_state).field_6 + 4));
      xr_packet::r_float(packet,(float *)((long)&(this->m_state).field_6 + 8));
      xr_packet::r_float(packet,(float *)((long)&(this->m_state).field_6 + 0xc));
      uVar2 = (int)(uint)this->m_num_items >> 5;
      (this->m_state).enabled = (uVar2 & 1) != 0;
      if ((uVar2 & 2) == 0) {
        xr_packet::r_vec3(packet,&(this->m_state).angular_vel);
      }
      else {
        _vector3<float>::set(&(this->m_state).angular_vel,0.0,0.0,0.0);
      }
      if ((uVar2 & 4) == 0) {
        xr_packet::r_vec3(packet,&(this->m_state).linear_vel);
      }
      else {
        _vector3<float>::set(&(this->m_state).linear_vel,0.0,0.0,0.0);
      }
      bVar1 = xr_packet::r_eof(packet);
      if (!bVar1) {
        xr_packet::r_bool(packet);
      }
    }
  }
  return;
}

Assistant:

void cse_alife_object_physic::update_read(xr_packet& packet)
{
	cse_ph_skeleton::update_read(packet);
	if (!packet.r_eof()) {
		xr_assert(m_version >= CSE_VERSION_0x7a && m_version <= CSE_VERSION_COP);
		packet.r_u8(m_num_items);
		if (m_num_items) {
			packet.r_vec3(m_state.force);
			packet.r_vec3(m_state.torque);
			packet.r_vec3(m_state.position);
			packet.r_float(m_state.quaternion.x);
			packet.r_float(m_state.quaternion.y);
			packet.r_float(m_state.quaternion.z);
			packet.r_float(m_state.quaternion.w);
			uint_fast16_t flags = m_num_items >> 5;
			m_state.enabled = (flags & 1) != 0;
			if (flags & 0x2)
				m_state.angular_vel.set(0, 0, 0);
			else
				packet.r_vec3(m_state.angular_vel);
			if (flags & 0x4)
				m_state.linear_vel.set(0, 0, 0);
			else
				packet.r_vec3(m_state.linear_vel);
			if (!packet.r_eof())
				packet.r_bool();
		}
	}
}